

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Deserializer::ParseMinifooter(BP3Deserializer *this,BufferSTL *bufferSTL)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  pointer pcVar5;
  pointer pcVar6;
  long lVar7;
  bool bVar8;
  pointer pcVar9;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string err;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar5 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar1 = pcVar5[-4];
  pcVar6 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < bVar1) {
    std::__cxx11::to_string(&local_c8,(uint)bVar1);
    std::operator+(&local_e8,"The endianness flag in the .bp file was neither zero nor one (",
                   &local_c8);
    std::operator+(&err,&local_e8,
                   "), this indicates the the file is either corrupted, or not a .bp file.");
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&local_e8,"Toolkit",(allocator *)&local_48);
    std::__cxx11::string::string
              ((string *)&local_c8,"format::bp::BP3Deserializer",(allocator *)&local_68);
    std::__cxx11::string::string((string *)&local_a8,"ParseMinifooter",&local_eb);
    helper::Throw<std::runtime_error>(&local_e8,&local_c8,&local_a8,&err,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&err);
  }
  (this->m_Minifooter).IsLittleEndian = bVar1 == 0;
  bVar8 = helper::IsLittleEndian();
  if ((this->m_Minifooter).IsLittleEndian != bVar8) {
    std::__cxx11::string::string((string *)&err,"Toolkit",(allocator *)&local_48);
    std::__cxx11::string::string
              ((string *)&local_e8,"format::bp::BP3Deserializer",(allocator *)&local_68);
    std::__cxx11::string::string((string *)&local_c8,"ParseMinifooter",&local_eb);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
               ,&local_ea);
    helper::Throw<std::runtime_error>(&err,&local_e8,&local_c8,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&err);
  }
  pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = true;
  if (pcVar5[(long)(pcVar9 + (-2 - (long)pcVar6))] != 3) {
    if ((pcVar5[(long)(pcVar9 + (-2 - (long)pcVar6))] & 0xfdU) != 0) goto LAB_00527b8f;
    bVar8 = false;
  }
  (this->m_Minifooter).HasSubFiles = bVar8;
LAB_00527b8f:
  cVar2 = pcVar5[(long)(pcVar9 + (-1 - (long)pcVar6))];
  (this->m_Minifooter).Version = cVar2;
  if (cVar2 < '\x03') {
    std::__cxx11::string::string((string *)&err,"Toolkit",&local_eb);
    std::__cxx11::string::string((string *)&local_e8,"format::bp::BP3Deserializer",&local_ea);
    std::__cxx11::string::string((string *)&local_c8,"ParseMinifooter",&local_e9);
    std::__cxx11::to_string(&local_68,(int)(this->m_Minifooter).Version);
    std::operator+(&local_48,"ADIOS2 only supports bp format version 3 and above, found ",&local_68)
    ;
    std::operator+(&local_a8,&local_48," version");
    helper::Throw<std::runtime_error>(&err,&local_e8,&local_c8,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&err);
    pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lVar7 = -(ulong)*(uint *)(&this->field_0x198 + *(long *)(*(long *)this + -0x18)) - (long)pcVar6;
  std::__cxx11::string::assign((char *)&this->m_Minifooter,(ulong)(pcVar5 + (long)(pcVar9 + lVar7)))
  ;
  pcVar6 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2 = pcVar5[(long)(pcVar6 + lVar7 + 0x18)];
  (this->m_Minifooter).ADIOSVersionMajor = cVar2 - 0x30U;
  cVar3 = pcVar5[(long)(pcVar6 + lVar7 + 0x19)];
  (this->m_Minifooter).ADIOSVersionMinor = cVar3 - 0x30U;
  cVar4 = pcVar5[(long)(pcVar6 + lVar7 + 0x1a)];
  (this->m_Minifooter).ADIOSVersionPatch = cVar4 - 0x30U;
  (this->m_Minifooter).ADIOSVersion =
       (uint)(byte)(cVar4 - 0x30U) +
       (uint)(byte)(cVar3 - 0x30U) * 1000 + (uint)(byte)(cVar2 - 0x30U) * 1000000;
  (this->m_Minifooter).PGIndexStart = *(uint64_t *)(pcVar5 + (long)(pcVar6 + lVar7 + 0x1c));
  (this->m_Minifooter).VarsIndexStart = *(uint64_t *)(pcVar5 + (long)(pcVar6 + lVar7 + 0x24));
  (this->m_Minifooter).AttributesIndexStart = *(uint64_t *)(pcVar5 + (long)(pcVar6 + lVar7 + 0x2c));
  return;
}

Assistant:

void BP3Deserializer::ParseMinifooter(const BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    const size_t bufferSize = buffer.size();
    size_t position = bufferSize - 4;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    if (endianness > 1)
    {
        std::string err = "The endianness flag in the .bp file was neither zero nor one (" +
                          std::to_string(endianness) +
                          "), this indicates the the file is either corrupted, or not a .bp "
                          "file.";
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter", err);
    }
    m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
    if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "reader found BigEndian bp file, "
                                          "this version of ADIOS2 wasn't compiled "
                                          "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                          "explicitly, in call to Open");
    }
#endif

    position += 1;

    const int8_t fileType =
        helper::ReadValue<int8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (fileType == 3)
    {
        m_Minifooter.HasSubFiles = true;
    }
    else if (fileType == 0 || fileType == 2)
    {
        m_Minifooter.HasSubFiles = false;
    }

    m_Minifooter.Version =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (m_Minifooter.Version < 3)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "ADIOS2 only supports bp format "
                                          "version 3 and above, found " +
                                              std::to_string(m_Minifooter.Version) + " version");
    }

    position = bufferSize - m_MetadataSet.MiniFooterSize;

    // Writer's ADIOS version
    m_Minifooter.VersionTag.assign(&buffer[position], 28);
    position += 24;
    m_Minifooter.ADIOSVersionMajor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionMinor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionPatch =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                m_Minifooter.ADIOSVersionMinor * 1000 +
                                m_Minifooter.ADIOSVersionPatch;
    ++position;
    ;

    m_Minifooter.PGIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.VarsIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.AttributesIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
}